

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_directory.cpp
# Opt level: O0

FileReader * __thiscall FDirectoryLump::NewReader(FDirectoryLump *this)

{
  FileReader *this_00;
  char *filename;
  CRecoverableError *anon_var_0;
  FDirectoryLump *this_local;
  
  this_00 = (FileReader *)operator_new(0x30);
  filename = FString::operator_cast_to_char_(&this->mFullPath);
  FileReader::FileReader(this_00,filename);
  return this_00;
}

Assistant:

FileReader *FDirectoryLump::NewReader()
{
	try
	{
		return new FileReader(mFullPath);
	}
	catch (CRecoverableError &)
	{
		return NULL;
	}
}